

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic_simplification.cpp
# Opt level: O2

void __thiscall
duckdb::ArithmeticSimplificationRule::ArithmeticSimplificationRule
          (ArithmeticSimplificationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TypeMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> _Var4;
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var5;
  pointer pFVar6;
  reference pvVar7;
  pointer pEVar8;
  long lVar9;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> local_f0;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  allocator local_e4;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> local_e0;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_d8 [4];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_027a95b0;
  make_uniq<duckdb::FunctionExpressionMatcher>();
  pFVar6 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_f0);
  make_uniq<duckdb::ConstantExpressionMatcher>();
  local_d8[0]._M_head_impl = (ExpressionMatcher *)local_58._M_buckets;
  local_58._M_buckets = (__buckets_ptr)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar6->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)local_d8);
  if (local_d8[0]._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_d8[0]._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  local_d8[0]._M_head_impl = (ExpressionMatcher *)0x0;
  if (local_58._M_buckets != (__buckets_ptr)0x0) {
    (*(code *)(*local_58._M_buckets)[1]._M_nxt)();
  }
  pFVar6 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_f0);
  make_uniq<duckdb::ExpressionMatcher>();
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar6->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)local_d8);
  if (local_d8[0]._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_d8[0]._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pFVar6 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_f0);
  pFVar6->policy = SOME;
  ::std::__cxx11::string::string((string *)local_d8,"+",&local_e1);
  ::std::__cxx11::string::string(local_b8,"-",&local_e2);
  ::std::__cxx11::string::string(local_98,anon_var_dwarf_4b4b2f1 + 8,&local_e3);
  ::std::__cxx11::string::string(local_78,"//",&local_e4);
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_58,local_d8,&local_58,0,&local_e5,&local_e6,&local_e7);
  make_uniq<duckdb::ManyFunctionMatcher,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((duckdb *)&local_e0,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58);
  _Var5._M_head_impl = local_e0._M_head_impl;
  local_e0._M_head_impl = (FunctionMatcher *)0x0;
  pFVar6 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_f0);
  _Var1._M_head_impl =
       (pFVar6->function).
       super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
       .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl;
  (pFVar6->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var1._M_head_impl != (FunctionMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FunctionMatcher[1])();
  }
  if (local_e0._M_head_impl != (FunctionMatcher *)0x0) {
    (**(code **)(*(long *)local_e0._M_head_impl + 8))();
  }
  local_e0._M_head_impl = (FunctionMatcher *)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_58);
  lVar9 = 0x60;
  do {
    ::std::__cxx11::string::~string((string *)((long)&local_d8[0]._M_head_impl + lVar9));
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  make_uniq<duckdb::IntegerTypeMatcher>();
  _Var3._M_head_impl = local_d8[0]._M_head_impl;
  local_d8[0]._M_head_impl = (ExpressionMatcher *)0x0;
  pFVar6 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_f0);
  _Var2._M_head_impl =
       (pFVar6->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pFVar6->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var3._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_d8[0]._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_d8[0]._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::IntegerTypeMatcher>();
  _Var3._M_head_impl = local_d8[0]._M_head_impl;
  local_d8[0]._M_head_impl = (ExpressionMatcher *)0x0;
  pFVar6 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_f0);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
           ::get<true>(&pFVar6->matchers,0);
  pEVar8 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(pvVar7);
  _Var2._M_head_impl =
       (pEVar8->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar8->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var3._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_d8[0]._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_d8[0]._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::IntegerTypeMatcher>();
  _Var3._M_head_impl = local_d8[0]._M_head_impl;
  local_d8[0]._M_head_impl = (ExpressionMatcher *)0x0;
  pFVar6 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_f0);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
           ::get<true>(&pFVar6->matchers,1);
  pEVar8 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(pvVar7);
  _Var2._M_head_impl =
       (pEVar8->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar8->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var3._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_d8[0]._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_d8[0]._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  _Var4._M_head_impl = local_f0._M_head_impl;
  local_f0._M_head_impl = (FunctionExpressionMatcher *)0x0;
  _Var3._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var4._M_head_impl)->super_ExpressionMatcher;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
    if (local_f0._M_head_impl != (FunctionExpressionMatcher *)0x0) {
      (*((local_f0._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
    }
  }
  return;
}

Assistant:

ArithmeticSimplificationRule::ArithmeticSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on an OperatorExpression that has a ConstantExpression as child
	auto op = make_uniq<FunctionExpressionMatcher>();
	op->matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	op->matchers.push_back(make_uniq<ExpressionMatcher>());
	op->policy = SetMatcher::Policy::SOME;
	// we only match on simple arithmetic expressions (+, -, *, /)
	op->function = make_uniq<ManyFunctionMatcher>(unordered_set<string> {"+", "-", "*", "//"});
	// and only with numeric results
	op->type = make_uniq<IntegerTypeMatcher>();
	op->matchers[0]->type = make_uniq<IntegerTypeMatcher>();
	op->matchers[1]->type = make_uniq<IntegerTypeMatcher>();
	root = std::move(op);
}